

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassInfo.h
# Opt level: O0

void __thiscall ClassInfo::reset_temps(ClassInfo *this)

{
  int local_54;
  int *local_50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  int local_3c;
  int *local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  int local_24;
  int *local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18;
  ClassInfo *local_10;
  ClassInfo *this_local;
  
  local_10 = this;
  local_18._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->tmpe);
  local_20 = (int *)std::vector<int,_std::allocator<int>_>::end(&this->tmpe);
  local_24 = 0;
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (local_18,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_20,
             &local_24);
  local_30._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->tmpm);
  local_38 = (int *)std::vector<int,_std::allocator<int>_>::end(&this->tmpm);
  local_3c = 0;
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (local_30,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_38,
             &local_3c);
  local_48._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->tmpl);
  local_50 = (int *)std::vector<int,_std::allocator<int>_>::end(&this->tmpl);
  local_54 = 0;
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (local_48,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_50,
             &local_54);
  return;
}

Assistant:

void reset_temps() {
        std::fill(tmpe.begin(), tmpe.end(), 0);
        std::fill(tmpm.begin(), tmpm.end(), 0);
        std::fill(tmpl.begin(), tmpl.end(), 0);
    }